

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::ReadOffsets(OffsetData *offset_data,uchar *head,uchar **marker,size_t size,char **err)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  char **in_RCX;
  long *in_RDX;
  long in_RSI;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_RDI;
  tinyexr_uint64 offset;
  uint dx;
  uint dy;
  uint l;
  char **in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *msg;
  undefined1 local_a1 [56];
  allocator local_69;
  string local_68 [32];
  char **local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  char **local_28;
  long *local_20;
  long local_18;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_10;
  
  local_34 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    uVar1 = (ulong)local_34;
    sVar2 = std::
            vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            ::size(local_10);
    if (sVar2 <= uVar1) {
      return 0;
    }
    local_38 = 0;
    while( true ) {
      uVar1 = (ulong)local_38;
      pvVar3 = std::
               vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
               ::operator[](local_10,(ulong)local_34);
      sVar2 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::size(pvVar3);
      if (sVar2 <= uVar1) break;
      local_3c = 0;
      while( true ) {
        uVar1 = (ulong)local_3c;
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](local_10,(ulong)local_34);
        pvVar4 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar3,(ulong)local_38);
        sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar4);
        if (sVar2 <= uVar1) break;
        if ((ulong)(local_18 + (long)local_28) <= *local_20 + 8U) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_68,"Insufficient data size in offset table.",&local_69)
          ;
          SetErrorMessage(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          std::__cxx11::string::~string(local_68);
          std::allocator<char>::~allocator((allocator<char> *)&local_69);
          return -4;
        }
        local_48 = *(char ***)*local_20;
        swap8((tinyexr_uint64 *)&local_48);
        if (local_28 <= local_48) {
          msg = (string *)local_a1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_a1 + 1),"Invalid offset value in DecodeEXRImage.",
                     (allocator *)msg);
          SetErrorMessage(msg,in_stack_ffffffffffffff28);
          std::__cxx11::string::~string((string *)(local_a1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_a1);
          return -4;
        }
        *local_20 = *local_20 + 8;
        in_stack_ffffffffffffff28 = local_48;
        pvVar3 = std::
                 vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                 ::operator[](local_10,(ulong)local_34);
        pvVar4 = std::
                 vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ::operator[](pvVar3,(ulong)local_38);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar4,(ulong)local_3c);
        *pvVar5 = (value_type)in_stack_ffffffffffffff28;
        local_3c = local_3c + 1;
      }
      local_38 = local_38 + 1;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

static int ReadOffsets(OffsetData& offset_data,
                       const unsigned char* head,
                       const unsigned char*& marker,
                       const size_t size,
                       const char** err) {
  for (unsigned int l = 0; l < offset_data.offsets.size(); ++l) {
    for (unsigned int dy = 0; dy < offset_data.offsets[l].size(); ++dy) {
      for (unsigned int dx = 0; dx < offset_data.offsets[l][dy].size(); ++dx) {
        tinyexr::tinyexr_uint64 offset;
        if ((marker + sizeof(tinyexr_uint64)) >= (head + size)) {
          tinyexr::SetErrorMessage("Insufficient data size in offset table.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }

        memcpy(&offset, marker, sizeof(tinyexr::tinyexr_uint64));
        tinyexr::swap8(&offset);
        if (offset >= size) {
          tinyexr::SetErrorMessage("Invalid offset value in DecodeEXRImage.", err);
          return TINYEXR_ERROR_INVALID_DATA;
        }
        marker += sizeof(tinyexr::tinyexr_uint64);  // = 8
        offset_data.offsets[l][dy][dx] = offset;
      }
    }
  }
  return TINYEXR_SUCCESS;
}